

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void UnpackBitVectorToFlatIndexList(ImBitVector *in,ImVector<int> *out)

{
  int local_3c;
  uint local_38;
  uint local_34;
  ImU32 bit_n;
  ImU32 entries_32;
  ImU32 *it;
  ImU32 *it_end;
  ImU32 *it_begin;
  ImVector<int> *out_local;
  ImBitVector *in_local;
  
  it_begin = (ImU32 *)out;
  out_local = (ImVector<int> *)in;
  it_end = ImVector<unsigned_int>::begin(&in->Storage);
  it = ImVector<unsigned_int>::end((ImVector<unsigned_int> *)out_local);
  for (_bit_n = it_end; _bit_n < it; _bit_n = _bit_n + 1) {
    local_34 = *_bit_n;
    if (local_34 != 0) {
      for (local_38 = 0; local_38 < 0x20; local_38 = local_38 + 1) {
        if ((local_34 & 1 << ((byte)local_38 & 0x1f)) != 0) {
          local_3c = (int)(((long)_bit_n - (long)it_end >> 2) << 5) + local_38;
          ImVector<int>::push_back((ImVector<int> *)it_begin,&local_3c);
        }
      }
    }
  }
  return;
}

Assistant:

static void UnpackBitVectorToFlatIndexList(const ImBitVector* in, ImVector<int>* out)
{
    IM_ASSERT(sizeof(in->Storage.Data[0]) == sizeof(int));
    const ImU32* it_begin = in->Storage.begin();
    const ImU32* it_end = in->Storage.end();
    for (const ImU32* it = it_begin; it < it_end; it++)
        if (ImU32 entries_32 = *it)
            for (ImU32 bit_n = 0; bit_n < 32; bit_n++)
                if (entries_32 & ((ImU32)1 << bit_n))
                    out->push_back((int)(((it - it_begin) << 5) + bit_n));
}